

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O2

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateBatchedMatmulLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  string *this_00;
  bool bVar1;
  int iVar2;
  Type *pTVar3;
  uint32_t uVar4;
  undefined1 *puVar5;
  Result *_result;
  undefined1 *puVar6;
  uint32_t uVar7;
  string err;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  validateInputCount(__return_storage_ptr__,layer,1,2);
  bVar1 = Result::good(__return_storage_ptr__);
  if (!bVar1) {
    return __return_storage_ptr__;
  }
  this_00 = &__return_storage_ptr__->m_message;
  std::__cxx11::string::~string((string *)this_00);
  validateOutputCount(__return_storage_ptr__,layer,1,1);
  bVar1 = Result::good(__return_storage_ptr__);
  if (!bVar1) {
    return __return_storage_ptr__;
  }
  std::__cxx11::string::~string((string *)this_00);
  iVar2 = (layer->input_).super_RepeatedPtrFieldBase.current_size_;
  if (((iVar2 == 2) &&
      (iVar2 = 2, (layer->inputtensor_).super_RepeatedPtrFieldBase.current_size_ == 2)) &&
     ((layer->outputtensor_).super_RepeatedPtrFieldBase.current_size_ == 1)) {
    pTVar3 = google::protobuf::internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<CoreML::Specification::Tensor>::TypeHandler>
                       (&(layer->inputtensor_).super_RepeatedPtrFieldBase,0);
    uVar4 = pTVar3->rank_;
    pTVar3 = google::protobuf::internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<CoreML::Specification::Tensor>::TypeHandler>
                       (&(layer->inputtensor_).super_RepeatedPtrFieldBase,1);
    uVar7 = pTVar3->rank_;
    pTVar3 = google::protobuf::internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<CoreML::Specification::Tensor>::TypeHandler>
                       (&(layer->outputtensor_).super_RepeatedPtrFieldBase,0);
    if ((int)uVar7 < (int)uVar4) {
      uVar7 = uVar4;
    }
    uVar4 = 2;
    if (2 < (int)uVar7) {
      uVar4 = uVar7;
    }
    if (pTVar3->rank_ != uVar4) {
      std::operator+(&local_48,"BatchedMatMul layer \'",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
      std::operator+(&err,&local_48,
                     "\': given ranks of the two inputs, rank of the output is incorrect.");
      std::__cxx11::string::~string((string *)&local_48);
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&err);
      goto LAB_002ac57b;
    }
    iVar2 = (layer->input_).super_RepeatedPtrFieldBase.current_size_;
  }
  if (((iVar2 == 1) && ((layer->inputtensor_).super_RepeatedPtrFieldBase.current_size_ == 1)) &&
     ((layer->outputtensor_).super_RepeatedPtrFieldBase.current_size_ == 1)) {
    pTVar3 = google::protobuf::internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<CoreML::Specification::Tensor>::TypeHandler>
                       (&(layer->inputtensor_).super_RepeatedPtrFieldBase,0);
    uVar4 = pTVar3->rank_;
    pTVar3 = google::protobuf::internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<CoreML::Specification::Tensor>::TypeHandler>
                       (&(layer->outputtensor_).super_RepeatedPtrFieldBase,0);
    if (pTVar3->rank_ != uVar4) {
      std::operator+(&local_48,"BatchedMatMul layer \'",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
      std::operator+(&err,&local_48,
                     "\': has one input, in this case, output and input ranks must be equal but they are not."
                    );
      std::__cxx11::string::~string((string *)&local_48);
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&err);
      goto LAB_002ac57b;
    }
    iVar2 = (layer->input_).super_RepeatedPtrFieldBase.current_size_;
  }
  if (1 < iVar2) {
    puVar5 = *(undefined1 **)&layer->layer_;
    puVar6 = puVar5;
    if (layer->_oneof_case_[0] != 0x415) {
      puVar6 = Specification::_BatchedMatMulLayerParams_default_instance_;
    }
    if (((BatchedMatMulLayerParams *)puVar6)->hasbias_ == true) {
      std::operator+(&local_48,"BatchedMatMul layer \'",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
      std::operator+(&err,&local_48,
                     "\': has two inputs and \'hasBias\' flag is set to True.However, bias is only supported when the layer has 1 input."
                    );
      std::__cxx11::string::~string((string *)&local_48);
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&err);
    }
    else {
      if (((BatchedMatMulLayerParams *)puVar6)->int8dynamicquantize_ != true) goto LAB_002ac3ff;
      std::operator+(&local_48,"BatchedMatMul layer \'",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
      std::operator+(&err,&local_48,"\': cannot use dynamic quantization with 2 inputs.");
      std::__cxx11::string::~string((string *)&local_48);
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&err);
    }
LAB_002ac57b:
    std::__cxx11::string::~string((string *)&err);
    return __return_storage_ptr__;
  }
  puVar5 = *(undefined1 **)&layer->layer_;
LAB_002ac3ff:
  if (layer->_oneof_case_[0] != 0x415) {
    puVar5 = Specification::_BatchedMatMulLayerParams_default_instance_;
  }
  if (((BatchedMatMulLayerParams *)puVar5)->int8dynamicquantize_ == true) {
    puVar5 = (undefined1 *)(((ActivationParams *)puVar5)->NonlinearityType_).linear_;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&err,"BatchedMatMul",(allocator<char> *)&local_48);
    if ((WeightParams *)puVar5 == (WeightParams *)0x0) {
      puVar5 = Specification::_WeightParams_default_instance_;
    }
    validateInt8Requirements
              (__return_storage_ptr__,(WeightParams *)puVar5,&err,
               (string *)((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
    std::__cxx11::string::~string((string *)&err);
    bVar1 = Result::good(__return_storage_ptr__);
    if (!bVar1) {
      return __return_storage_ptr__;
    }
    std::__cxx11::string::~string((string *)this_00);
    iVar2 = (layer->input_).super_RepeatedPtrFieldBase.current_size_;
  }
  if (iVar2 == 1) {
    if (layer->_oneof_case_[0] == 0x415) {
      puVar5 = *(undefined1 **)&layer->layer_;
    }
    else {
      puVar5 = Specification::_BatchedMatMulLayerParams_default_instance_;
    }
    puVar6 = (undefined1 *)(((ActivationParams *)puVar5)->NonlinearityType_).linear_;
    if ((WeightParams *)puVar6 == (WeightParams *)0x0) {
      puVar6 = Specification::_WeightParams_default_instance_;
    }
    puVar5 = (undefined1 *)((InnerProductLayerParams *)puVar5)->bias_;
    if ((WeightParams *)puVar5 == (WeightParams *)0x0) {
      puVar5 = Specification::_WeightParams_default_instance_;
    }
    validateInnerProductWeightsBias
              (__return_storage_ptr__,layer,(WeightParams *)puVar6,(WeightParams *)puVar5);
    bVar1 = Result::good(__return_storage_ptr__);
    if (!bVar1) {
      return __return_storage_ptr__;
    }
    std::__cxx11::string::~string((string *)this_00);
  }
  Result::Result(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateBatchedMatmulLayer(const Specification::NeuralNetworkLayer& layer) {
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputCount(layer, 1, 2));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateOutputCount(layer, 1, 1));

    // validate rank, if present
    if (layer.input_size() == 2 && layer.inputtensor_size() == 2 && layer.outputtensor_size() == 1) {
        int in1_rank = static_cast<int>(layer.inputtensor(0).rank());
        int in2_rank = static_cast<int>(layer.inputtensor(1).rank());
        int out_rank = static_cast<int>(layer.outputtensor(0).rank());
        if (out_rank != std::max(2, std::max(in1_rank, in2_rank))) {
            std::string err = "BatchedMatMul layer '" + layer.name() + "': given ranks of the two inputs, rank of the output is incorrect.";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }
    }

    if (layer.input_size() == 1 && layer.inputtensor_size() == 1 && layer.outputtensor_size() == 1) {
        int in_rank = static_cast<int>(layer.inputtensor(0).rank());
        int out_rank = static_cast<int>(layer.outputtensor(0).rank());
        if (out_rank != in_rank) {
            std::string err = "BatchedMatMul layer '" + layer.name() + "': has one input, in this case, output and input ranks must be equal but they are not.";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }
    }

    if (layer.input_size() > 1 && layer.batchedmatmul().hasbias()) {
        std::string err = "BatchedMatMul layer '" + layer.name() + "': has two inputs and 'hasBias' flag is set to True."
                                "However, bias is only supported when the layer has 1 input.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }

    if (layer.input_size() > 1 && layer.batchedmatmul().int8dynamicquantize()) {
        std::string err = "BatchedMatMul layer '" + layer.name() + "': cannot use dynamic quantization with 2 inputs.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }

    if (layer.batchedmatmul().int8dynamicquantize()) {
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInt8Requirements(layer.batchedmatmul().weights(), "BatchedMatMul", layer.name()));
    }

    if (layer.input_size() == 1) {
        const auto& params = layer.batchedmatmul();
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInnerProductWeightsBias(layer, params.weights(), params.bias()));
    }

    return Result();
}